

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

int nni_sock_setopt(nni_sock *s,char *name,void *v,size_t sz,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock(&s->s_mx);
  iVar1 = 7;
  if (s->s_closing == false) {
    iVar1 = nni_setopt((s->s_sock_ops).sock_options,name,s->s_data,v,sz,t);
    if (iVar1 == 9) {
      iVar1 = nni_setopt(sock_options,name,s,v,sz,t);
    }
  }
  nni_mtx_unlock(&s->s_mx);
  return iVar1;
}

Assistant:

int
nni_sock_setopt(
    nni_sock *s, const char *name, const void *v, size_t sz, nni_type t)
{
	int rv;

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		return (NNG_ECLOSED);
	}

	// Protocol options.  The protocol can override options that
	// the socket framework would otherwise supply, like buffer
	// sizes.
	rv = nni_setopt(s->s_sock_ops.sock_options, name, s->s_data, v, sz, t);
	if (rv != NNG_ENOTSUP) {
		nni_mtx_unlock(&s->s_mx);
		return (rv);
	}

	rv = nni_setopt(sock_options, name, s, v, sz, t);
	nni_mtx_unlock(&s->s_mx);

	return (rv);
}